

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::StripWhitespace(string *str)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pcVar8;
  uint uVar9;
  
  uVar7 = str->_M_string_length;
  uVar9 = (uint)uVar7;
  if ((int)uVar9 < 1) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      uVar6 = uVar7;
      if (uVar7 == uVar5) goto LAB_002ca3d9;
      bVar1 = (str->_M_dataplus)._M_p[uVar5];
      if ((4 < bVar1 - 9) && (bVar1 != 0x20)) goto LAB_002ca325;
      uVar5 = uVar5 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar5);
    uVar5 = uVar7 & 0xffffffff;
  }
LAB_002ca325:
  uVar9 = uVar9 - (int)uVar5;
  if (uVar9 == 0) {
    str->_M_string_length = 0;
    pcVar8 = (str->_M_dataplus)._M_p;
  }
  else {
    uVar6 = uVar7;
    if ((int)uVar5 != 0) {
      std::__cxx11::string::erase((ulong)str,0);
      uVar6 = (ulong)uVar9;
    }
    iVar3 = (int)uVar6;
    bVar2 = 0 < iVar3;
    uVar9 = iVar3 - 1U;
    if (0 < iVar3) {
      uVar7 = str->_M_string_length;
      do {
        iVar4 = (int)uVar6;
        uVar9 = iVar4 - 1;
        uVar6 = (ulong)uVar9;
        if (uVar7 <= uVar6) {
LAB_002ca3d9:
          std::__throw_out_of_range_fmt
                    ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar6,
                     uVar7);
        }
        bVar1 = (str->_M_dataplus)._M_p[uVar6];
        if ((4 < bVar1 - 9) && (bVar1 != 0x20)) goto LAB_002ca393;
        bVar2 = 0 < iVar4 + -1;
        uVar6 = (ulong)(iVar4 - 1U);
      } while (iVar4 - 1U != 0 && 0 < iVar4);
      uVar9 = 0xffffffff;
    }
LAB_002ca393:
    if ((bool)(~bVar2 & 1U | uVar9 == iVar3 - 1U)) {
      return;
    }
    uVar7 = (ulong)(uVar9 + 1);
    if (str->_M_string_length < uVar7) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar7);
    }
    str->_M_string_length = uVar7;
    pcVar8 = (str->_M_dataplus)._M_p + uVar7;
  }
  *pcVar8 = '\0';
  return;
}

Assistant:

void StripWhitespace(string* str) {
  int str_length = str->length();

  // Strip off leading whitespace.
  int first = 0;
  while (first < str_length && ascii_isspace(str->at(first))) {
    ++first;
  }
  // If entire string is white space.
  if (first == str_length) {
    str->clear();
    return;
  }
  if (first > 0) {
    str->erase(0, first);
    str_length -= first;
  }

  // Strip off trailing whitespace.
  int last = str_length - 1;
  while (last >= 0 && ascii_isspace(str->at(last))) {
    --last;
  }
  if (last != (str_length - 1) && last >= 0) {
    str->erase(last + 1, string::npos);
  }
}